

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O2

void __thiscall fizplex::Simplex::set_basic_solution(Simplex *this,Base *base)

{
  DVector *x;
  double dVar1;
  size_t *psVar2;
  size_t i_00;
  bool bVar3;
  double *pdVar4;
  SVector *vec;
  size_t i;
  size_t *psVar5;
  ulong i_01;
  DVector beta;
  _Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> local_48;
  
  DVector::DVector(&beta,&this->lp->b);
  psVar2 = (this->non_basic_indices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  x = &this->x;
  for (psVar5 = (this->non_basic_indices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    i_00 = *psVar5;
    pdVar4 = DVector::operator[](x,i_00);
    dVar1 = *pdVar4;
    vec = ColMatrix::column(&this->lp->A,i_00);
    operator*((SVector *)&local_48,dVar1,vec);
    DVector::operator-=(&beta,(SVector *)&local_48);
    std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
    ~_Vector_base(&local_48);
  }
  Base::ftran(base,&beta);
  for (i_01 = 0;
      i_01 < (ulong)((long)(this->basic_indices).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->basic_indices).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3); i_01 = i_01 + 1) {
    pdVar4 = DVector::operator[](&beta,i_01);
    dVar1 = *pdVar4;
    pdVar4 = DVector::operator[](x,(this->basic_indices).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start[i_01]);
    *pdVar4 = dVar1;
  }
  if (this->phase == Two) {
    bVar3 = LP::is_feasible(this->lp,x);
    if (!bVar3) {
      __assert_fail("lp.is_feasible(x)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex.cc"
                    ,0x78,"void fizplex::Simplex::set_basic_solution(Base &)");
    }
  }
  operator_delete(beta.vals._M_data);
  return;
}

Assistant:

void Simplex::set_basic_solution(Base &base) {
  DVector beta = lp.b;
  for (auto i : non_basic_indices)
    beta -= x[i] * lp.A.column(i);
  base.ftran(beta);

  for (size_t i = 0; i < basic_indices.size(); i++)
    x[basic_indices[i]] = beta[i];

  if (phase == Phase::Two)
    assert(lp.is_feasible(x));
}